

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fvrf_data.c
# Opt level: O1

void test_checksum(fitsfile *infits,FILE *out)

{
  int iVar1;
  char *mess;
  int dataok;
  int hduok;
  int status;
  int local_14;
  int local_10 [2];
  
  local_10[1] = 0;
  iVar1 = ffvcks(infits,&local_14,local_10);
  if (iVar1 == 0) {
    if (local_14 == -1) {
      wrtwrn(out,"Data checksum is not consistent with  the DATASUM keyword",0);
    }
    if (local_10[0] == -1) {
      if (local_14 == 1) {
        mess = "Invalid CHECKSUM means header has been modified. (DATASUM is OK) ";
      }
      else {
        mess = "HDU checksum is not in agreement with CHECKSUM.";
      }
      wrtwrn(out,mess,0);
    }
  }
  else {
    wrtferr(out,"verifying checksums: ",local_10 + 1,2);
  }
  return;
}

Assistant:

void test_checksum(fitsfile *infits, 	/* input fits file   */ 
	      FILE	*out		/* output ascii file */
            )
{ 
    int status = 0; 
    int dataok, hduok;

    if (fits_verify_chksum(infits, &dataok, &hduok, &status))
    {
        wrtferr(out,"verifying checksums: ",&status,2);
        return;
    }

    if(dataok == -1)  
	wrtwrn(out,
        "Data checksum is not consistent with  the DATASUM keyword",0);

    if(hduok == -1 )  { 
	if(dataok == 1) { 
	   wrtwrn(out,
  "Invalid CHECKSUM means header has been modified. (DATASUM is OK) ",0);
        } 
	else {
	   wrtwrn(out, "HDU checksum is not in agreement with CHECKSUM.",0);
        }
    }
    return;
}